

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.c
# Opt level: O0

void sig_err_handler(int sig)

{
  pid_t pVar1;
  __pid_t _Var2;
  pid_list_item_t *local_20;
  pid_list_item_t *iter_1;
  tester_list_t *iter;
  _Bool ignored_err;
  int sig_local;
  
  pVar1 = main_pid;
  iter._3_1_ = 0;
  iter._4_4_ = sig;
  _Var2 = getpid();
  if (pVar1 == _Var2) {
    for (iter_1 = (pid_list_item_t *)tester_data; iter_1 != (pid_list_item_t *)0x0;
        iter_1 = iter_1->next) {
      if (*(long *)iter_1 != 0) {
        kill(**(__pid_t **)iter_1,0xf);
      }
    }
    for (local_20 = children; local_20 != (pid_list_item_t *)0x0; local_20 = local_20->next) {
      if (local_20->pid != -1) {
        kill(local_20->pid,0xf);
      }
    }
    validator_mq_finish(true,validator_mq,(_Bool *)((long)&iter + 3));
  }
  else {
    validator_mq_finish(false,validator_mq,(_Bool *)((long)&iter + 3));
  }
  tester_mq_finish(false,current_tester_mq,(char *)0x0,(_Bool *)((long)&iter + 3));
  exit(1);
}

Assistant:

static void sig_err_handler(int sig) {
    UNUSED(sig);

    bool ignored_err = false;
    if(main_pid == getpid()) {
        for(tester_list_t *iter = tester_data; iter != NULL; iter = iter->next) {
            if(iter->this != NULL) {
                kill(iter->this->pid, SIGTERM);
            }
        }
        for(pid_list_item_t *iter = children; iter != NULL; iter = iter->next) {
            if(iter->pid != PID_LIST_EMPTY_ITEM_PID) {
                kill(iter->pid, SIGTERM);
            }
        }
        validator_mq_finish(true, validator_mq, &ignored_err);
    } else {
        validator_mq_finish(false, validator_mq, &ignored_err);
    }
    tester_mq_finish(false, current_tester_mq, NULL, &ignored_err);
    // free is not a safe async function => have to rely on system to clean the list's dynamic memory
    exit(EXIT_FAILURE);
}